

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  float fVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  byte bVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  int iVar22;
  int iVar23;
  byte bVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  byte bVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined4 uVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [64];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar75 [32];
  float fVar79;
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  RTCFilterFunctionNArguments args;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  byte local_2840;
  undefined1 local_2810 [16];
  ulong local_27f8;
  ulong local_27f0;
  ulong *local_27e8;
  Scene *local_27e0;
  long local_27d8;
  RTCFilterFunctionNArguments local_27d0;
  undefined1 local_27a0 [32];
  undefined1 local_2770 [16];
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  RTCHitN local_2730 [16];
  undefined1 local_2720 [16];
  undefined1 local_2710 [16];
  undefined1 local_2700 [16];
  undefined4 local_26f0;
  undefined4 uStack_26ec;
  undefined4 uStack_26e8;
  undefined4 uStack_26e4;
  undefined1 local_26e0 [16];
  undefined1 local_26d0 [16];
  uint local_26c0;
  uint uStack_26bc;
  uint uStack_26b8;
  uint uStack_26b4;
  uint uStack_26b0;
  uint uStack_26ac;
  uint uStack_26a8;
  uint uStack_26a4;
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0;
  size_t local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  uint uVar31;
  
  local_27e8 = local_2390;
  local_23a0 = root.ptr;
  local_2398[0] = 0;
  auVar39 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar81 = ZEXT3264(auVar39);
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x10)));
  auVar82 = ZEXT3264(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar83 = ZEXT3264(auVar41);
  auVar38 = vmulss_avx512f(auVar39._0_16_,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  uVar56 = auVar38._0_4_;
  auVar42._4_4_ = uVar56;
  auVar42._0_4_ = uVar56;
  auVar42._8_4_ = uVar56;
  auVar42._12_4_ = uVar56;
  auVar42._16_4_ = uVar56;
  auVar42._20_4_ = uVar56;
  auVar42._24_4_ = uVar56;
  auVar42._28_4_ = uVar56;
  auVar38 = vmulss_avx512f(auVar40._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x10)));
  uVar56 = auVar38._0_4_;
  auVar43._4_4_ = uVar56;
  auVar43._0_4_ = uVar56;
  auVar43._8_4_ = uVar56;
  auVar43._12_4_ = uVar56;
  auVar43._16_4_ = uVar56;
  auVar43._20_4_ = uVar56;
  auVar43._24_4_ = uVar56;
  auVar43._28_4_ = uVar56;
  auVar38 = vmulss_avx512f(auVar41._0_16_,
                           ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  uVar56 = auVar38._0_4_;
  auVar41._4_4_ = uVar56;
  auVar41._0_4_ = uVar56;
  auVar41._8_4_ = uVar56;
  auVar41._12_4_ = uVar56;
  auVar41._16_4_ = uVar56;
  auVar41._20_4_ = uVar56;
  auVar41._24_4_ = uVar56;
  auVar41._28_4_ = uVar56;
  local_27f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_27f8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar33 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar34 = local_27f0 ^ 0x20;
  uVar36 = local_27f8 ^ 0x20;
  iVar2 = (tray->tfar).field_0.i[k];
  auVar60 = ZEXT3264(CONCAT428(iVar2,CONCAT424(iVar2,CONCAT420(iVar2,CONCAT416(iVar2,CONCAT412(iVar2
                                                  ,CONCAT48(iVar2,CONCAT44(iVar2,iVar2))))))));
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar84 = ZEXT3264(auVar39);
  auVar40 = vxorps_avx512vl(auVar42,auVar39);
  auVar85 = ZEXT3264(auVar40);
  auVar40 = vxorps_avx512vl(auVar43,auVar39);
  auVar86 = ZEXT3264(auVar40);
  auVar39 = vxorps_avx512vl(auVar41,auVar39);
  auVar87 = ZEXT3264(auVar39);
  auVar39 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar88 = ZEXT3264(auVar39);
  auVar38 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar89 = ZEXT1664(auVar38);
  auVar39 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
  auVar90 = ZEXT3264(auVar39);
  auVar39 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
  auVar91 = ZEXT3264(auVar39);
  auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
  auVar92 = ZEXT1664(auVar38);
  do {
    pfVar1 = (float *)(local_27e8 + -1);
    local_27e8 = local_27e8 + -2;
    if (*pfVar1 <= *(float *)(ray + k * 4 + 0x80)) {
      uVar35 = *local_27e8;
      while ((uVar35 & 8) == 0) {
        auVar39 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + local_27f0),auVar85._0_32_,
                             auVar81._0_32_);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + local_27f8),auVar86._0_32_,
                             auVar82._0_32_);
        auVar39 = vpmaxsd_avx2(auVar39,auVar40);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + uVar33),auVar87._0_32_,
                             auVar83._0_32_);
        auVar40 = vpmaxsd_avx512vl(auVar40,auVar88._0_32_);
        auVar39 = vpmaxsd_avx2(auVar39,auVar40);
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + uVar34),auVar85._0_32_,
                             auVar81._0_32_);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + uVar36),auVar86._0_32_,
                             auVar82._0_32_);
        auVar40 = vpminsd_avx2(auVar40,auVar41);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [32])(uVar35 + 0x40 + (uVar33 ^ 0x20)),auVar87._0_32_,
                             auVar83._0_32_);
        auVar41 = vpminsd_avx2(auVar41,auVar60._0_32_);
        auVar40 = vpminsd_avx2(auVar40,auVar41);
        uVar32 = vpcmpd_avx512vl(auVar39,auVar40,2);
        bVar24 = (byte)uVar32;
        if (bVar24 == 0) goto LAB_00795101;
        auVar40 = *(undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0);
        auVar41 = ((undefined1 (*) [32])(uVar35 & 0xfffffffffffffff0))[1];
        auVar42 = vmovdqa64_avx512vl(auVar90._0_32_);
        auVar42 = vpternlogd_avx512vl(auVar42,auVar39,auVar91._0_32_,0xf8);
        auVar43 = vpcompressd_avx512vl(auVar42);
        auVar45._0_4_ =
             (uint)(bVar24 & 1) * auVar43._0_4_ | (uint)!(bool)(bVar24 & 1) * auVar42._0_4_;
        bVar12 = (bool)((byte)(uVar32 >> 1) & 1);
        auVar45._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar42._4_4_;
        bVar12 = (bool)((byte)(uVar32 >> 2) & 1);
        auVar45._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar42._8_4_;
        bVar12 = (bool)((byte)(uVar32 >> 3) & 1);
        auVar45._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar42._12_4_;
        bVar12 = (bool)((byte)(uVar32 >> 4) & 1);
        auVar45._16_4_ = (uint)bVar12 * auVar43._16_4_ | (uint)!bVar12 * auVar42._16_4_;
        bVar12 = (bool)((byte)(uVar32 >> 5) & 1);
        auVar45._20_4_ = (uint)bVar12 * auVar43._20_4_ | (uint)!bVar12 * auVar42._20_4_;
        bVar12 = (bool)((byte)(uVar32 >> 6) & 1);
        auVar45._24_4_ = (uint)bVar12 * auVar43._24_4_ | (uint)!bVar12 * auVar42._24_4_;
        bVar12 = SUB81(uVar32 >> 7,0);
        auVar45._28_4_ = (uint)bVar12 * auVar43._28_4_ | (uint)!bVar12 * auVar42._28_4_;
        auVar42 = vpermt2q_avx512vl(auVar40,auVar45,auVar41);
        uVar35 = auVar42._0_8_;
        bVar24 = bVar24 - 1 & bVar24;
        if (bVar24 != 0) {
          auVar42 = vpshufd_avx2(auVar45,0x55);
          vpermt2q_avx512vl(auVar40,auVar42,auVar41);
          auVar43 = vpminsd_avx2(auVar45,auVar42);
          auVar42 = vpmaxsd_avx2(auVar45,auVar42);
          bVar24 = bVar24 - 1 & bVar24;
          if (bVar24 == 0) {
            auVar43 = vpermi2q_avx512vl(auVar43,auVar40,auVar41);
            uVar35 = auVar43._0_8_;
            auVar40 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
            *local_27e8 = auVar40._0_8_;
            auVar39 = vpermd_avx2(auVar42,auVar39);
            *(int *)(local_27e8 + 1) = auVar39._0_4_;
            local_27e8 = local_27e8 + 2;
          }
          else {
            auVar47 = vpshufd_avx2(auVar45,0xaa);
            vpermt2q_avx512vl(auVar40,auVar47,auVar41);
            auVar46 = vpminsd_avx2(auVar43,auVar47);
            auVar43 = vpmaxsd_avx2(auVar43,auVar47);
            auVar47 = vpminsd_avx2(auVar42,auVar43);
            auVar42 = vpmaxsd_avx2(auVar42,auVar43);
            bVar24 = bVar24 - 1 & bVar24;
            if (bVar24 == 0) {
              auVar43 = vpermi2q_avx512vl(auVar46,auVar40,auVar41);
              uVar35 = auVar43._0_8_;
              auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
              *local_27e8 = auVar43._0_8_;
              auVar42 = vpermd_avx2(auVar42,auVar39);
              *(int *)(local_27e8 + 1) = auVar42._0_4_;
              auVar40 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
              local_27e8[2] = auVar40._0_8_;
              auVar39 = vpermd_avx2(auVar47,auVar39);
              *(int *)(local_27e8 + 3) = auVar39._0_4_;
              local_27e8 = local_27e8 + 4;
            }
            else {
              auVar43 = vpshufd_avx2(auVar45,0xff);
              vpermt2q_avx512vl(auVar40,auVar43,auVar41);
              auVar48 = vpminsd_avx2(auVar46,auVar43);
              auVar43 = vpmaxsd_avx2(auVar46,auVar43);
              auVar46 = vpminsd_avx2(auVar47,auVar43);
              auVar43 = vpmaxsd_avx2(auVar47,auVar43);
              auVar47 = vpminsd_avx2(auVar42,auVar43);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              bVar24 = bVar24 - 1 & bVar24;
              if (bVar24 == 0) {
                auVar43 = vpermi2q_avx512vl(auVar48,auVar40,auVar41);
                uVar35 = auVar43._0_8_;
                auVar43 = vpermt2q_avx512vl(auVar40,auVar42,auVar41);
                *local_27e8 = auVar43._0_8_;
                auVar42 = vpermd_avx2(auVar42,auVar39);
                *(int *)(local_27e8 + 1) = auVar42._0_4_;
                auVar42 = vpermt2q_avx512vl(auVar40,auVar47,auVar41);
                local_27e8[2] = auVar42._0_8_;
                auVar42 = vpermd_avx2(auVar47,auVar39);
                *(int *)(local_27e8 + 3) = auVar42._0_4_;
                auVar40 = vpermt2q_avx512vl(auVar40,auVar46,auVar41);
                local_27e8[4] = auVar40._0_8_;
                auVar39 = vpermd_avx2(auVar46,auVar39);
                *(int *)(local_27e8 + 5) = auVar39._0_4_;
                local_27e8 = local_27e8 + 6;
              }
              else {
                auVar44 = valignd_avx512vl(auVar45,auVar45,3);
                auVar45 = vmovdqa64_avx512vl(auVar92._0_32_);
                auVar43 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar45 = vpermt2d_avx512vl(auVar45,auVar43,auVar48);
                auVar43 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar45 = vpermt2d_avx512vl(auVar45,auVar43,auVar46);
                auVar45 = vpermt2d_avx512vl(auVar45,auVar43,auVar47);
                auVar43 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar42 = vpermt2d_avx512vl(auVar45,auVar43,auVar42);
                auVar69 = ZEXT3264(auVar42);
                bVar28 = bVar24;
                do {
                  auVar43 = auVar69._0_32_;
                  auVar47._8_4_ = 1;
                  auVar47._0_8_ = 0x100000001;
                  auVar47._12_4_ = 1;
                  auVar47._16_4_ = 1;
                  auVar47._20_4_ = 1;
                  auVar47._24_4_ = 1;
                  auVar47._28_4_ = 1;
                  auVar42 = vpermd_avx2(auVar47,auVar44);
                  auVar44 = valignd_avx512vl(auVar44,auVar44,1);
                  vpermt2q_avx512vl(auVar40,auVar44,auVar41);
                  bVar28 = bVar28 - 1 & bVar28;
                  uVar16 = vpcmpd_avx512vl(auVar42,auVar43,5);
                  auVar42 = vpmaxsd_avx2(auVar42,auVar43);
                  bVar17 = (byte)uVar16 << 1;
                  auVar43 = valignd_avx512vl(auVar43,auVar43,7);
                  bVar12 = (bool)((byte)uVar16 & 1);
                  auVar46._4_4_ = (uint)bVar12 * auVar43._4_4_ | (uint)!bVar12 * auVar42._4_4_;
                  auVar46._0_4_ = auVar42._0_4_;
                  bVar12 = (bool)(bVar17 >> 2 & 1);
                  auVar46._8_4_ = (uint)bVar12 * auVar43._8_4_ | (uint)!bVar12 * auVar42._8_4_;
                  bVar12 = (bool)(bVar17 >> 3 & 1);
                  auVar46._12_4_ = (uint)bVar12 * auVar43._12_4_ | (uint)!bVar12 * auVar42._12_4_;
                  bVar12 = (bool)(bVar17 >> 4 & 1);
                  auVar46._16_4_ = (uint)bVar12 * auVar43._16_4_ | (uint)!bVar12 * auVar42._16_4_;
                  bVar12 = (bool)(bVar17 >> 5 & 1);
                  auVar46._20_4_ = (uint)bVar12 * auVar43._20_4_ | (uint)!bVar12 * auVar42._20_4_;
                  bVar12 = (bool)(bVar17 >> 6 & 1);
                  auVar46._24_4_ = (uint)bVar12 * auVar43._24_4_ | (uint)!bVar12 * auVar42._24_4_;
                  auVar46._28_4_ =
                       (uint)(bVar17 >> 7) * auVar43._28_4_ |
                       (uint)!(bool)(bVar17 >> 7) * auVar42._28_4_;
                  auVar69 = ZEXT3264(auVar46);
                } while (bVar28 != 0);
                lVar26 = (ulong)(uint)POPCOUNT((uint)bVar24) + 3;
                do {
                  auVar42 = vpermi2q_avx512vl(auVar46,auVar40,auVar41);
                  *local_27e8 = auVar42._0_8_;
                  auVar43 = auVar69._0_32_;
                  auVar42 = vpermd_avx2(auVar43,auVar39);
                  *(int *)(local_27e8 + 1) = auVar42._0_4_;
                  auVar46 = valignd_avx512vl(auVar43,auVar43,1);
                  local_27e8 = local_27e8 + 2;
                  auVar69 = ZEXT3264(auVar46);
                  lVar26 = lVar26 + -1;
                } while (lVar26 != 0);
                auVar39 = vpermt2q_avx512vl(auVar40,auVar46,auVar41);
                uVar35 = auVar39._0_8_;
              }
            }
          }
        }
      }
      uVar32 = (ulong)((uint)uVar35 & 0xf);
      if (uVar32 != 8) {
        uVar35 = uVar35 & 0xfffffffffffffff0;
        local_27d8 = 0;
        do {
          lVar27 = local_27d8 * 0xe0;
          lVar26 = uVar35 + 0xd0 + lVar27;
          local_2760 = *(undefined8 *)(lVar26 + 0x10);
          uStack_2758 = *(undefined8 *)(lVar26 + 0x18);
          lVar26 = uVar35 + 0xc0 + lVar27;
          local_25a0 = *(undefined8 *)(lVar26 + 0x10);
          uStack_2598 = *(undefined8 *)(lVar26 + 0x18);
          uStack_2590 = local_25a0;
          uStack_2588 = uStack_2598;
          uStack_2750 = local_2760;
          uStack_2748 = uStack_2758;
          auVar63._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x60 + lVar27);
          auVar63._0_16_ = *(undefined1 (*) [16])(uVar35 + lVar27);
          auVar68._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x70 + lVar27);
          auVar68._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x10 + lVar27);
          auVar70._16_16_ = *(undefined1 (*) [16])(uVar35 + 0x80 + lVar27);
          auVar70._0_16_ = *(undefined1 (*) [16])(uVar35 + 0x20 + lVar27);
          auVar38 = *(undefined1 (*) [16])(uVar35 + 0x30 + lVar27);
          auVar39._16_16_ = auVar38;
          auVar39._0_16_ = auVar38;
          auVar5 = *(undefined1 (*) [16])(uVar35 + 0x40 + lVar27);
          auVar40._16_16_ = auVar5;
          auVar40._0_16_ = auVar5;
          auVar6 = *(undefined1 (*) [16])(uVar35 + 0x50 + lVar27);
          auVar61._16_16_ = auVar6;
          auVar61._0_16_ = auVar6;
          auVar7 = *(undefined1 (*) [16])(uVar35 + 0x90 + lVar27);
          auVar71._16_16_ = auVar7;
          auVar71._0_16_ = auVar7;
          auVar7 = *(undefined1 (*) [16])(uVar35 + 0xa0 + lVar27);
          auVar72._16_16_ = auVar7;
          auVar72._0_16_ = auVar7;
          auVar7 = *(undefined1 (*) [16])(uVar35 + 0xb0 + lVar27);
          auVar73._16_16_ = auVar7;
          auVar73._0_16_ = auVar7;
          auVar39 = vsubps_avx(auVar63,auVar39);
          auVar40 = vsubps_avx(auVar68,auVar40);
          auVar41 = vsubps_avx(auVar70,auVar61);
          auVar42 = vsubps_avx(auVar71,auVar63);
          auVar43 = vsubps_avx(auVar72,auVar68);
          auVar45 = vsubps_avx(auVar73,auVar70);
          auVar51._4_4_ = auVar40._4_4_ * auVar45._4_4_;
          auVar51._0_4_ = auVar40._0_4_ * auVar45._0_4_;
          auVar51._8_4_ = auVar40._8_4_ * auVar45._8_4_;
          auVar51._12_4_ = auVar40._12_4_ * auVar45._12_4_;
          auVar51._16_4_ = auVar40._16_4_ * auVar45._16_4_;
          auVar51._20_4_ = auVar40._20_4_ * auVar45._20_4_;
          auVar51._24_4_ = auVar40._24_4_ * auVar45._24_4_;
          auVar51._28_4_ = auVar38._12_4_;
          auVar7 = vfmsub231ps_fma(auVar51,auVar43,auVar41);
          auVar52._4_4_ = auVar41._4_4_ * auVar42._4_4_;
          auVar52._0_4_ = auVar41._0_4_ * auVar42._0_4_;
          auVar52._8_4_ = auVar41._8_4_ * auVar42._8_4_;
          auVar52._12_4_ = auVar41._12_4_ * auVar42._12_4_;
          auVar52._16_4_ = auVar41._16_4_ * auVar42._16_4_;
          auVar52._20_4_ = auVar41._20_4_ * auVar42._20_4_;
          auVar52._24_4_ = auVar41._24_4_ * auVar42._24_4_;
          auVar52._28_4_ = auVar5._12_4_;
          auVar5 = vfmsub231ps_fma(auVar52,auVar45,auVar39);
          auVar53._4_4_ = auVar39._4_4_ * auVar43._4_4_;
          auVar53._0_4_ = auVar39._0_4_ * auVar43._0_4_;
          auVar53._8_4_ = auVar39._8_4_ * auVar43._8_4_;
          auVar53._12_4_ = auVar39._12_4_ * auVar43._12_4_;
          auVar53._16_4_ = auVar39._16_4_ * auVar43._16_4_;
          auVar53._20_4_ = auVar39._20_4_ * auVar43._20_4_;
          auVar53._24_4_ = auVar39._24_4_ * auVar43._24_4_;
          auVar53._28_4_ = auVar6._12_4_;
          uVar56 = *(undefined4 *)(ray + k * 4 + 0x40);
          auVar75._4_4_ = uVar56;
          auVar75._0_4_ = uVar56;
          auVar75._8_4_ = uVar56;
          auVar75._12_4_ = uVar56;
          auVar75._16_4_ = uVar56;
          auVar75._20_4_ = uVar56;
          auVar75._24_4_ = uVar56;
          auVar75._28_4_ = uVar56;
          auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x50)));
          auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
          uVar56 = *(undefined4 *)(ray + k * 4);
          auVar48._4_4_ = uVar56;
          auVar48._0_4_ = uVar56;
          auVar48._8_4_ = uVar56;
          auVar48._12_4_ = uVar56;
          auVar48._16_4_ = uVar56;
          auVar48._20_4_ = uVar56;
          auVar48._24_4_ = uVar56;
          auVar48._28_4_ = uVar56;
          auVar48 = vsubps_avx512vl(auVar63,auVar48);
          auVar6 = vfmsub231ps_fma(auVar53,auVar42,auVar40);
          uVar56 = *(undefined4 *)(ray + k * 4 + 0x10);
          auVar44._4_4_ = uVar56;
          auVar44._0_4_ = uVar56;
          auVar44._8_4_ = uVar56;
          auVar44._12_4_ = uVar56;
          auVar44._16_4_ = uVar56;
          auVar44._20_4_ = uVar56;
          auVar44._24_4_ = uVar56;
          auVar44._28_4_ = uVar56;
          auVar44 = vsubps_avx512vl(auVar68,auVar44);
          uVar56 = *(undefined4 *)(ray + k * 4 + 0x20);
          auVar49._4_4_ = uVar56;
          auVar49._0_4_ = uVar56;
          auVar49._8_4_ = uVar56;
          auVar49._12_4_ = uVar56;
          auVar49._16_4_ = uVar56;
          auVar49._20_4_ = uVar56;
          auVar49._24_4_ = uVar56;
          auVar49._28_4_ = uVar56;
          auVar49 = vsubps_avx512vl(auVar70,auVar49);
          auVar50 = vmulps_avx512vl(auVar46,auVar49);
          auVar51 = vfmsub231ps_avx512vl(auVar50,auVar44,auVar47);
          auVar50 = vmulps_avx512vl(auVar47,auVar48);
          auVar52 = vfmsub231ps_avx512vl(auVar50,auVar49,auVar75);
          auVar50 = vmulps_avx512vl(auVar75,auVar44);
          auVar53 = vfmsub231ps_avx512vl(auVar50,auVar48,auVar46);
          auVar47 = vmulps_avx512vl(ZEXT1632(auVar6),auVar47);
          auVar46 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar5),auVar46);
          local_2520 = vfmadd231ps_avx512vl(auVar46,ZEXT1632(auVar7),auVar75);
          auVar50._8_4_ = 0x7fffffff;
          auVar50._0_8_ = 0x7fffffff7fffffff;
          auVar50._12_4_ = 0x7fffffff;
          auVar50._16_4_ = 0x7fffffff;
          auVar50._20_4_ = 0x7fffffff;
          auVar50._24_4_ = 0x7fffffff;
          auVar50._28_4_ = 0x7fffffff;
          vandps_avx512vl(local_2520,auVar50);
          vandps_avx512vl(local_2520,auVar84._0_32_);
          auVar45 = vmulps_avx512vl(auVar45,auVar53);
          auVar43 = vfmadd231ps_avx512vl(auVar45,auVar52,auVar43);
          auVar38 = vfmadd231ps_fma(auVar43,auVar51,auVar42);
          fVar62 = local_2520._0_4_;
          local_2580._0_4_ = (float)((uint)fVar62 ^ auVar38._0_4_);
          fVar65 = local_2520._4_4_;
          local_2580._4_4_ = (float)((uint)fVar65 ^ auVar38._4_4_);
          fVar66 = local_2520._8_4_;
          local_2580._8_4_ = (float)((uint)fVar66 ^ auVar38._8_4_);
          fVar67 = local_2520._12_4_;
          local_2580._12_4_ = (float)((uint)fVar67 ^ auVar38._12_4_);
          fVar76 = local_2520._16_4_;
          local_2580._16_4_ = fVar76;
          fVar77 = local_2520._20_4_;
          local_2580._20_4_ = fVar77;
          fVar78 = local_2520._24_4_;
          local_2580._24_4_ = fVar78;
          fVar79 = local_2520._28_4_;
          local_2580._28_4_ = fVar79;
          auVar41 = vmulps_avx512vl(auVar41,auVar53);
          auVar40 = vfmadd231ps_avx512vl(auVar41,auVar40,auVar52);
          auVar38 = vfmadd231ps_fma(auVar40,auVar39,auVar51);
          local_2560._0_4_ = (float)((uint)fVar62 ^ auVar38._0_4_);
          local_2560._4_4_ = (float)((uint)fVar65 ^ auVar38._4_4_);
          local_2560._8_4_ = (float)((uint)fVar66 ^ auVar38._8_4_);
          local_2560._12_4_ = (float)((uint)fVar67 ^ auVar38._12_4_);
          local_2560._16_4_ = fVar76;
          local_2560._20_4_ = fVar77;
          local_2560._24_4_ = fVar78;
          local_2560._28_4_ = fVar79;
          uVar16 = vcmpps_avx512vl(local_2580,ZEXT832(0) << 0x20,5);
          uVar13 = vcmpps_avx512vl(local_2560,ZEXT832(0) << 0x20,5);
          uVar14 = vcmpps_avx512vl(local_2520,ZEXT832(0) << 0x20,4);
          auVar80._0_4_ = local_2580._0_4_ + local_2560._0_4_;
          auVar80._4_4_ = local_2580._4_4_ + local_2560._4_4_;
          auVar80._8_4_ = local_2580._8_4_ + local_2560._8_4_;
          auVar80._12_4_ = local_2580._12_4_ + local_2560._12_4_;
          auVar80._16_4_ = fVar76 + fVar76;
          auVar80._20_4_ = fVar77 + fVar77;
          auVar80._24_4_ = fVar78 + fVar78;
          auVar80._28_4_ = fVar79 + fVar79;
          uVar15 = vcmpps_avx512vl(auVar80,local_2520,2);
          local_24a0 = (byte)uVar16 & (byte)uVar13 & (byte)uVar14 & (byte)uVar15;
          if (local_24a0 != 0) {
            auVar19._4_4_ = auVar49._4_4_ * auVar6._4_4_;
            auVar19._0_4_ = auVar49._0_4_ * auVar6._0_4_;
            auVar19._8_4_ = auVar49._8_4_ * auVar6._8_4_;
            auVar19._12_4_ = auVar49._12_4_ * auVar6._12_4_;
            auVar19._16_4_ = auVar49._16_4_ * 0.0;
            auVar19._20_4_ = auVar49._20_4_ * 0.0;
            auVar19._24_4_ = auVar49._24_4_ * 0.0;
            auVar19._28_4_ = auVar49._28_4_;
            auVar38 = vfmadd213ps_fma(auVar44,ZEXT1632(auVar5),auVar19);
            auVar38 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar7),ZEXT1632(auVar38));
            local_2540._0_4_ = (float)((uint)fVar62 ^ auVar38._0_4_);
            local_2540._4_4_ = (float)((uint)fVar65 ^ auVar38._4_4_);
            local_2540._8_4_ = (float)((uint)fVar66 ^ auVar38._8_4_);
            local_2540._12_4_ = (float)((uint)fVar67 ^ auVar38._12_4_);
            local_2540._16_4_ = fVar76;
            local_2540._20_4_ = fVar77;
            local_2540._24_4_ = fVar78;
            local_2540._28_4_ = fVar79;
            uVar56 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar18._4_4_ = uVar56;
            auVar18._0_4_ = uVar56;
            auVar18._8_4_ = uVar56;
            auVar18._12_4_ = uVar56;
            auVar18._16_4_ = uVar56;
            auVar18._20_4_ = uVar56;
            auVar18._24_4_ = uVar56;
            auVar18._28_4_ = uVar56;
            auVar39 = vmulps_avx512vl(local_2520,auVar18);
            uVar16 = vcmpps_avx512vl(auVar39,local_2540,1);
            fVar3 = *(float *)(ray + k * 4 + 0x80);
            auVar60 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,
                                                  CONCAT412(fVar3,CONCAT48(fVar3,CONCAT44(fVar3,
                                                  fVar3))))))));
            auVar20._4_4_ = fVar3 * fVar65;
            auVar20._0_4_ = fVar3 * fVar62;
            auVar20._8_4_ = fVar3 * fVar66;
            auVar20._12_4_ = fVar3 * fVar67;
            auVar20._16_4_ = fVar3 * fVar76;
            auVar20._20_4_ = fVar3 * fVar77;
            auVar20._24_4_ = fVar3 * fVar78;
            auVar20._28_4_ = auVar39._28_4_;
            uVar13 = vcmpps_avx512vl(local_2540,auVar20,2);
            local_24a0 = (byte)uVar16 & (byte)uVar13 & local_24a0;
            if (local_24a0 != 0) {
              local_2500 = ZEXT1632(auVar7);
              local_24e0 = ZEXT1632(auVar5);
              local_24c0 = ZEXT1632(auVar6);
              local_23c0 = 0xf0;
              local_27e0 = context->scene;
              auVar39 = vrcp14ps_avx512vl(local_2520);
              auVar74._8_4_ = 0x3f800000;
              auVar74._0_8_ = 0x3f8000003f800000;
              auVar74._12_4_ = 0x3f800000;
              auVar74._16_4_ = 0x3f800000;
              auVar74._20_4_ = 0x3f800000;
              auVar74._24_4_ = 0x3f800000;
              auVar74._28_4_ = 0x3f800000;
              auVar38 = vfnmadd213ps_fma(local_2520,auVar39,auVar74);
              auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar39,auVar39);
              fVar62 = auVar38._0_4_;
              fVar65 = auVar38._4_4_;
              local_2440._4_4_ = fVar65 * local_2540._4_4_;
              local_2440._0_4_ = fVar62 * local_2540._0_4_;
              fVar66 = auVar38._8_4_;
              local_2440._8_4_ = fVar66 * local_2540._8_4_;
              fVar67 = auVar38._12_4_;
              local_2440._12_4_ = fVar67 * local_2540._12_4_;
              local_2440._16_4_ = fVar76 * 0.0;
              local_2440._20_4_ = fVar77 * 0.0;
              local_2440._24_4_ = fVar78 * 0.0;
              local_2440._28_4_ = auVar39._28_4_;
              auVar69 = ZEXT3264(local_2440);
              auVar21._4_4_ = fVar65 * local_2580._4_4_;
              auVar21._0_4_ = fVar62 * local_2580._0_4_;
              auVar21._8_4_ = fVar66 * local_2580._8_4_;
              auVar21._12_4_ = fVar67 * local_2580._12_4_;
              auVar21._16_4_ = fVar76 * 0.0;
              auVar21._20_4_ = fVar77 * 0.0;
              auVar21._24_4_ = fVar78 * 0.0;
              auVar21._28_4_ = fVar79;
              auVar39 = vminps_avx(auVar21,auVar74);
              auVar64._0_4_ = fVar62 * local_2560._0_4_;
              auVar64._4_4_ = fVar65 * local_2560._4_4_;
              auVar64._8_4_ = fVar66 * local_2560._8_4_;
              auVar64._12_4_ = fVar67 * local_2560._12_4_;
              auVar64._16_4_ = fVar76 * 0.0;
              auVar64._20_4_ = fVar77 * 0.0;
              auVar64._24_4_ = fVar78 * 0.0;
              auVar64._28_4_ = 0;
              auVar40 = vminps_avx(auVar64,auVar74);
              auVar41 = vsubps_avx(auVar74,auVar39);
              auVar42 = vsubps_avx(auVar74,auVar40);
              local_2460 = vblendps_avx(auVar40,auVar41,0xf0);
              local_2480 = vblendps_avx(auVar39,auVar42,0xf0);
              fVar62 = (float)DAT_01fef940;
              local_2420._0_4_ = auVar7._0_4_ * fVar62;
              fVar65 = DAT_01fef940._4_4_;
              local_2420._4_4_ = auVar7._4_4_ * fVar65;
              fVar66 = DAT_01fef940._8_4_;
              local_2420._8_4_ = auVar7._8_4_ * fVar66;
              fVar67 = DAT_01fef940._12_4_;
              local_2420._12_4_ = auVar7._12_4_ * fVar67;
              fVar76 = DAT_01fef940._16_4_;
              local_2420._16_4_ = fVar76 * 0.0;
              fVar77 = DAT_01fef940._20_4_;
              local_2420._20_4_ = fVar77 * 0.0;
              fVar78 = DAT_01fef940._24_4_;
              local_2420._24_4_ = fVar78 * 0.0;
              local_2420._28_4_ = 0;
              local_2400._0_4_ = auVar5._0_4_ * fVar62;
              local_2400._4_4_ = auVar5._4_4_ * fVar65;
              local_2400._8_4_ = auVar5._8_4_ * fVar66;
              local_2400._12_4_ = auVar5._12_4_ * fVar67;
              local_2400._16_4_ = fVar76 * 0.0;
              local_2400._20_4_ = fVar77 * 0.0;
              local_2400._24_4_ = fVar78 * 0.0;
              local_2400._28_4_ = 0;
              local_23e0._4_4_ = auVar6._4_4_ * fVar65;
              local_23e0._0_4_ = auVar6._0_4_ * fVar62;
              local_23e0._8_4_ = auVar6._8_4_ * fVar66;
              local_23e0._12_4_ = auVar6._12_4_ * fVar67;
              local_23e0._16_4_ = fVar76 * 0.0;
              local_23e0._20_4_ = fVar77 * 0.0;
              local_23e0._24_4_ = fVar78 * 0.0;
              local_23e0._28_4_ = 0;
              auVar57._8_4_ = 0x7f800000;
              auVar57._0_8_ = 0x7f8000007f800000;
              auVar57._12_4_ = 0x7f800000;
              auVar57._16_4_ = 0x7f800000;
              auVar57._20_4_ = 0x7f800000;
              auVar57._24_4_ = 0x7f800000;
              auVar57._28_4_ = 0x7f800000;
              auVar39 = vblendmps_avx512vl(auVar57,local_2440);
              auVar54._0_4_ =
                   (uint)(local_24a0 & 1) * auVar39._0_4_ |
                   (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 1 & 1);
              auVar54._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 2 & 1);
              auVar54._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 3 & 1);
              auVar54._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 4 & 1);
              auVar54._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 5 & 1);
              auVar54._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * 0x7f800000;
              bVar12 = (bool)(local_24a0 >> 6 & 1);
              auVar54._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * 0x7f800000;
              auVar54._28_4_ =
                   (uint)(local_24a0 >> 7) * auVar39._28_4_ |
                   (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
              auVar39 = vshufps_avx(auVar54,auVar54,0xb1);
              auVar39 = vminps_avx(auVar54,auVar39);
              auVar40 = vshufpd_avx(auVar39,auVar39,5);
              auVar39 = vminps_avx(auVar39,auVar40);
              auVar40 = vpermpd_avx2(auVar39,0x4e);
              auVar39 = vminps_avx(auVar39,auVar40);
              uVar16 = vcmpps_avx512vl(auVar54,auVar39,0);
              uVar25 = (uint)local_24a0;
              bVar24 = local_24a0;
              if (((byte)uVar16 & local_24a0) != 0) {
                bVar24 = (byte)uVar16 & local_24a0;
              }
              uVar31 = 0;
              for (uVar29 = (uint)bVar24; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
                uVar31 = uVar31 + 1;
              }
              do {
                uVar30 = uVar31 & 0xff;
                uVar29 = *(uint *)((long)&local_25a0 + (ulong)uVar30 * 4);
                pGVar8 = (local_27e0->geometries).items[uVar29].ptr;
                local_2840 = (byte)uVar25;
                if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  uVar25 = (uint)(~(byte)(1 << (uVar31 & 0x1f)) & local_2840);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    uVar37 = (ulong)(uVar30 << 2);
                    uVar56 = *(undefined4 *)(local_2480 + uVar37);
                    uVar4 = *(undefined4 *)(local_2460 + uVar37);
                    *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar37);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_2420 + uVar37);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_2400 + uVar37);
                    *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar37);
                    *(undefined4 *)(ray + k * 4 + 0xf0) = uVar56;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
                    *(undefined4 *)(ray + k * 4 + 0x110) =
                         *(undefined4 *)((long)&local_2760 + uVar37);
                    *(uint *)(ray + k * 4 + 0x120) = uVar29;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    break;
                  }
                  local_26a0 = auVar69._0_32_;
                  local_27a0 = auVar60._0_32_;
                  local_2680 = vmovdqa64_avx512vl(auVar88._0_32_);
                  local_2660 = auVar87._0_32_;
                  local_2640 = auVar86._0_32_;
                  local_2620 = auVar85._0_32_;
                  local_2600 = auVar83._0_32_;
                  local_25e0 = auVar82._0_32_;
                  local_25c0 = auVar81._0_32_;
                  uVar37 = (ulong)(uVar30 * 4);
                  uVar56 = *(undefined4 *)(local_2480 + uVar37);
                  local_2700._4_4_ = uVar56;
                  local_2700._0_4_ = uVar56;
                  local_2700._8_4_ = uVar56;
                  local_2700._12_4_ = uVar56;
                  local_26f0 = *(undefined4 *)(local_2460 + uVar37);
                  local_26d0 = vpbroadcastd_avx512vl();
                  uVar56 = *(undefined4 *)((long)&local_2760 + uVar37);
                  local_26e0._4_4_ = uVar56;
                  local_26e0._0_4_ = uVar56;
                  local_26e0._8_4_ = uVar56;
                  local_26e0._12_4_ = uVar56;
                  uVar56 = *(undefined4 *)(local_2420 + uVar37);
                  uVar4 = *(undefined4 *)(local_2400 + uVar37);
                  local_2720._4_4_ = uVar4;
                  local_2720._0_4_ = uVar4;
                  local_2720._8_4_ = uVar4;
                  local_2720._12_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_23e0 + uVar37);
                  local_2710._4_4_ = uVar4;
                  local_2710._0_4_ = uVar4;
                  local_2710._8_4_ = uVar4;
                  local_2710._12_4_ = uVar4;
                  local_2730[0] = (RTCHitN)(char)uVar56;
                  local_2730[1] = (RTCHitN)(char)((uint)uVar56 >> 8);
                  local_2730[2] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                  local_2730[3] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                  local_2730[4] = (RTCHitN)(char)uVar56;
                  local_2730[5] = (RTCHitN)(char)((uint)uVar56 >> 8);
                  local_2730[6] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                  local_2730[7] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                  local_2730[8] = (RTCHitN)(char)uVar56;
                  local_2730[9] = (RTCHitN)(char)((uint)uVar56 >> 8);
                  local_2730[10] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                  local_2730[0xb] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                  local_2730[0xc] = (RTCHitN)(char)uVar56;
                  local_2730[0xd] = (RTCHitN)(char)((uint)uVar56 >> 8);
                  local_2730[0xe] = (RTCHitN)(char)((uint)uVar56 >> 0x10);
                  local_2730[0xf] = (RTCHitN)(char)((uint)uVar56 >> 0x18);
                  uStack_26ec = local_26f0;
                  uStack_26e8 = local_26f0;
                  uStack_26e4 = local_26f0;
                  vpcmpeqd_avx2(ZEXT1632(local_2700),ZEXT1632(local_2700));
                  uStack_26bc = context->user->instID[0];
                  local_26c0 = uStack_26bc;
                  uStack_26b8 = uStack_26bc;
                  uStack_26b4 = uStack_26bc;
                  uStack_26b0 = context->user->instPrimID[0];
                  uStack_26ac = uStack_26b0;
                  uStack_26a8 = uStack_26b0;
                  uStack_26a4 = uStack_26b0;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar37);
                  auVar38 = auVar89._0_16_;
                  local_2810 = vmovdqa64_avx512vl(auVar38);
                  local_27d0.valid = (int *)local_2810;
                  local_27d0.geometryUserPtr = pGVar8->userPtr;
                  local_27d0.context = context->user;
                  local_27d0.hit = local_2730;
                  local_27d0.N = 4;
                  local_2770 = vmovdqa64_avx512vl(auVar38);
                  auVar38 = vmovdqa64_avx512vl(auVar38);
                  local_27d0.ray = (RTCRayN *)ray;
                  if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar8->intersectionFilterN)(&local_27d0);
                    auVar38 = local_2810;
                  }
                  uVar37 = vptestmd_avx512vl(auVar38,auVar38);
                  if ((uVar37 & 0xf) == 0) {
LAB_00794f56:
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_27a0._0_4_;
                  }
                  else {
                    p_Var9 = context->args->filter;
                    if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var9)(&local_27d0);
                      auVar38 = local_2810;
                    }
                    uVar37 = vptestmd_avx512vl(auVar38,auVar38);
                    uVar37 = uVar37 & 0xf;
                    bVar24 = (byte)uVar37;
                    if (bVar24 == 0) goto LAB_00794f56;
                    iVar2 = *(int *)(local_27d0.hit + 4);
                    iVar22 = *(int *)(local_27d0.hit + 8);
                    iVar23 = *(int *)(local_27d0.hit + 0xc);
                    bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar11 = SUB81(uVar37 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xc0) =
                         (uint)(bVar24 & 1) * *(int *)local_27d0.hit |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_27d0.ray + 0xc0);
                    *(uint *)(local_27d0.ray + 0xc4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xc4);
                    *(uint *)(local_27d0.ray + 200) =
                         (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27d0.ray + 200);
                    *(uint *)(local_27d0.ray + 0xcc) =
                         (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xcc);
                    iVar2 = *(int *)(local_27d0.hit + 0x14);
                    iVar22 = *(int *)(local_27d0.hit + 0x18);
                    iVar23 = *(int *)(local_27d0.hit + 0x1c);
                    bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar11 = SUB81(uVar37 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xd0) =
                         (uint)(bVar24 & 1) * *(int *)(local_27d0.hit + 0x10) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_27d0.ray + 0xd0);
                    *(uint *)(local_27d0.ray + 0xd4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xd4);
                    *(uint *)(local_27d0.ray + 0xd8) =
                         (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xd8);
                    *(uint *)(local_27d0.ray + 0xdc) =
                         (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xdc);
                    iVar2 = *(int *)(local_27d0.hit + 0x24);
                    iVar22 = *(int *)(local_27d0.hit + 0x28);
                    iVar23 = *(int *)(local_27d0.hit + 0x2c);
                    bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar11 = SUB81(uVar37 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xe0) =
                         (uint)(bVar24 & 1) * *(int *)(local_27d0.hit + 0x20) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_27d0.ray + 0xe0);
                    *(uint *)(local_27d0.ray + 0xe4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xe4);
                    *(uint *)(local_27d0.ray + 0xe8) =
                         (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xe8);
                    *(uint *)(local_27d0.ray + 0xec) =
                         (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xec);
                    iVar2 = *(int *)(local_27d0.hit + 0x34);
                    iVar22 = *(int *)(local_27d0.hit + 0x38);
                    iVar23 = *(int *)(local_27d0.hit + 0x3c);
                    bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar11 = SUB81(uVar37 >> 3,0);
                    *(uint *)(local_27d0.ray + 0xf0) =
                         (uint)(bVar24 & 1) * *(int *)(local_27d0.hit + 0x30) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_27d0.ray + 0xf0);
                    *(uint *)(local_27d0.ray + 0xf4) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0xf4);
                    *(uint *)(local_27d0.ray + 0xf8) =
                         (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0xf8);
                    *(uint *)(local_27d0.ray + 0xfc) =
                         (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0xfc);
                    iVar2 = *(int *)(local_27d0.hit + 0x44);
                    iVar22 = *(int *)(local_27d0.hit + 0x48);
                    iVar23 = *(int *)(local_27d0.hit + 0x4c);
                    bVar12 = (bool)((byte)(uVar37 >> 1) & 1);
                    bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                    bVar11 = SUB81(uVar37 >> 3,0);
                    *(uint *)(local_27d0.ray + 0x100) =
                         (uint)(bVar24 & 1) * *(int *)(local_27d0.hit + 0x40) |
                         (uint)!(bool)(bVar24 & 1) * *(int *)(local_27d0.ray + 0x100);
                    *(uint *)(local_27d0.ray + 0x104) =
                         (uint)bVar12 * iVar2 | (uint)!bVar12 * *(int *)(local_27d0.ray + 0x104);
                    *(uint *)(local_27d0.ray + 0x108) =
                         (uint)bVar10 * iVar22 | (uint)!bVar10 * *(int *)(local_27d0.ray + 0x108);
                    *(uint *)(local_27d0.ray + 0x10c) =
                         (uint)bVar11 * iVar23 | (uint)!bVar11 * *(int *)(local_27d0.ray + 0x10c);
                    auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x50));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x110) = auVar38;
                    auVar38 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x60));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x120) = auVar38;
                    auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x70));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x130) = auVar38;
                    auVar38 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_27d0.hit + 0x80));
                    *(undefined1 (*) [16])(local_27d0.ray + 0x140) = auVar38;
                    local_27a0 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                  }
                  auVar60 = ZEXT3264(local_27a0);
                  uVar56 = local_27a0._0_4_;
                  auVar59._4_4_ = uVar56;
                  auVar59._0_4_ = uVar56;
                  auVar59._8_4_ = uVar56;
                  auVar59._12_4_ = uVar56;
                  auVar59._16_4_ = uVar56;
                  auVar59._20_4_ = uVar56;
                  auVar59._24_4_ = uVar56;
                  auVar59._28_4_ = uVar56;
                  auVar69 = ZEXT3264(local_26a0);
                  uVar16 = vcmpps_avx512vl(local_26a0,auVar59,2);
                  uVar25 = (uint)(~(byte)(1 << (uVar31 & 0x1f)) & local_2840) & (uint)uVar16;
                  auVar81 = ZEXT3264(local_25c0);
                  auVar82 = ZEXT3264(local_25e0);
                  auVar83 = ZEXT3264(local_2600);
                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar84 = ZEXT3264(auVar39);
                  auVar85 = ZEXT3264(local_2620);
                  auVar86 = ZEXT3264(local_2640);
                  auVar87 = ZEXT3264(local_2660);
                  auVar39 = vmovdqa64_avx512vl(local_2680);
                  auVar88 = ZEXT3264(auVar39);
                  auVar38 = vmovdqa64_avx512vl(local_2770);
                  auVar89 = ZEXT1664(auVar38);
                  auVar39 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                  auVar90 = ZEXT3264(auVar39);
                  auVar39 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                  auVar91 = ZEXT3264(auVar39);
                  auVar38 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                  auVar92 = ZEXT1664(auVar38);
                }
                bVar24 = (byte)uVar25;
                if (bVar24 == 0) break;
                auVar58._8_4_ = 0x7f800000;
                auVar58._0_8_ = 0x7f8000007f800000;
                auVar58._12_4_ = 0x7f800000;
                auVar58._16_4_ = 0x7f800000;
                auVar58._20_4_ = 0x7f800000;
                auVar58._24_4_ = 0x7f800000;
                auVar58._28_4_ = 0x7f800000;
                auVar39 = vblendmps_avx512vl(auVar58,auVar69._0_32_);
                auVar55._0_4_ =
                     (uint)(bVar24 & 1) * auVar39._0_4_ | (uint)!(bool)(bVar24 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar12 * auVar39._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar12 * auVar39._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 3) & 1);
                auVar55._12_4_ = (uint)bVar12 * auVar39._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 4) & 1);
                auVar55._16_4_ = (uint)bVar12 * auVar39._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 5) & 1);
                auVar55._20_4_ = (uint)bVar12 * auVar39._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar25 >> 6) & 1);
                auVar55._24_4_ = (uint)bVar12 * auVar39._24_4_ | (uint)!bVar12 * 0x7f800000;
                auVar55._28_4_ =
                     (uVar25 >> 7) * auVar39._28_4_ | (uint)!SUB41(uVar25 >> 7,0) * 0x7f800000;
                auVar39 = vshufps_avx(auVar55,auVar55,0xb1);
                auVar39 = vminps_avx(auVar55,auVar39);
                auVar40 = vshufpd_avx(auVar39,auVar39,5);
                auVar39 = vminps_avx(auVar39,auVar40);
                auVar40 = vpermpd_avx2(auVar39,0x4e);
                auVar39 = vminps_avx(auVar39,auVar40);
                uVar16 = vcmpps_avx512vl(auVar55,auVar39,0);
                bVar24 = (byte)uVar16 & bVar24;
                uVar29 = uVar25;
                if (bVar24 != 0) {
                  uVar29 = (uint)bVar24;
                }
                uVar31 = 0;
                for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
                  uVar31 = uVar31 + 1;
                }
              } while( true );
            }
          }
          local_27d8 = local_27d8 + 1;
        } while (local_27d8 != uVar32 - 8);
      }
      uVar56 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar60 = ZEXT3264(CONCAT428(uVar56,CONCAT424(uVar56,CONCAT420(uVar56,CONCAT416(uVar56,
                                                  CONCAT412(uVar56,CONCAT48(uVar56,CONCAT44(uVar56,
                                                  uVar56))))))));
    }
LAB_00795101:
    if (local_27e8 == &local_23a0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }